

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<bool> __thiscall tinyusdz::primvar::PrimVar::is_ts_value_blocked(PrimVar *this,size_t idx)

{
  pointer pSVar1;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar2;
  ulong in_RDX;
  
  if (*(long *)(idx + 0x28) != *(long *)(idx + 0x20)) {
    pvVar2 = tinyusdz::value::TimeSamples::get_samples((TimeSamples *)(idx + 0x20));
    if (in_RDX < (ulong)(((long)(pvVar2->
                                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar2->
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               )._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      pvVar2 = tinyusdz::value::TimeSamples::get_samples((TimeSamples *)(idx + 0x20));
      pSVar1 = (pvVar2->
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(undefined1 *)&(this->_value).v_.storage = 1;
      *(bool *)((long)&(this->_value).v_.storage + 1) = pSVar1[in_RDX].blocked;
      goto LAB_001f91ec;
    }
  }
  *(undefined2 *)&(this->_value).v_.storage = 0;
LAB_001f91ec:
  return SUB82(this,0);
}

Assistant:

nonstd::optional<bool> is_ts_value_blocked(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    if (idx >= _ts.get_samples().size()) {
      return nonstd::nullopt;
    }

    return _ts.get_samples()[idx].blocked;
  }